

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
BoolNode::Evaluate(string *__return_storage_ptr__,BoolNode *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *parameters,cmGeneratorExpressionContext *param_2,
                  GeneratorExpressionContent *param_3,cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  char *pcVar2;
  allocator local_9;
  
  bVar1 = cmSystemTools::IsOff
                    ((((parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  pcVar2 = "1";
  if (bVar1) {
    pcVar2 = "0";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *,
                       const GeneratorExpressionContent *,
                       cmGeneratorExpressionDAGChecker *) const
  {
    return !cmSystemTools::IsOff(parameters.begin()->c_str()) ? "1" : "0";
  }